

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O3

matrix<double> * __thiscall
mat_lib::matrix<double>::inverse(matrix<double> *__return_storage_ptr__,matrix<double> *this)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  void *pvVar6;
  void *pvVar7;
  element_t *peVar8;
  logic_error *this_00;
  int i;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  int k;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  
  uVar3 = this->rows__;
  if ((uVar3 == this->columns__) && (uVar10 = uVar3 * uVar3, 1 < uVar10)) {
    lVar9 = 0;
    uVar14 = -(ulong)(uVar10 + 2 >> 0x3d != 0) | uVar10 * 8 + 0x10;
    pvVar6 = operator_new__(uVar14);
    do {
      pvVar7 = operator_new__(uVar14);
      *(void **)((long)pvVar6 + lVar9 * 8) = pvVar7;
      lVar9 = lVar9 + 1;
    } while (uVar10 - lVar9 != 0);
    if (uVar3 != 0) {
      uVar14 = 0;
      do {
        if ((uVar3 & 0x7fffffffffffffff) != 0) {
          memset(*(void **)((long)pvVar6 + uVar14 * 8),0,uVar3 << 4);
        }
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
      peVar8 = this->elements__;
      uVar14 = 0;
      do {
        lVar9 = *(long *)((long)pvVar6 + uVar14 * 8);
        uVar11 = 0;
        do {
          *(element_t *)(lVar9 + uVar11 * 8) = peVar8[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar3 != uVar11);
        uVar14 = uVar14 + 1;
        peVar8 = peVar8 + uVar3;
      } while (uVar14 != uVar3);
    }
    (__return_storage_ptr__->super_base_matrix<double>).format__ = fixed;
    (__return_storage_ptr__->super_base_matrix<double>).fractional_digits__ = 6;
    __return_storage_ptr__->rows__ = uVar3;
    __return_storage_ptr__->columns__ = uVar3;
    uVar14 = 0xffffffffffffffff;
    if (uVar10 < 0x2000000000000000) {
      uVar14 = uVar10 * 8;
    }
    peVar8 = (element_t *)operator_new__(uVar14);
    __return_storage_ptr__->elements__ = peVar8;
    uVar15 = (uint)uVar3;
    if (0 < (int)uVar15) {
      uVar14 = (ulong)(uVar15 & 0x7fffffff);
      uVar10 = (ulong)(uVar15 * 2);
      lVar9 = -uVar14;
      uVar11 = 0;
      do {
        lVar13 = 0;
        do {
          if (lVar9 == lVar13) {
            *(undefined8 *)(*(long *)((long)pvVar6 + uVar11 * 8) + (uVar11 + uVar14) * 8) =
                 0x3ff0000000000000;
          }
          lVar13 = lVar13 + -1;
        } while (-lVar13 != uVar10);
        uVar11 = uVar11 + 1;
        lVar9 = lVar9 + -1;
      } while (uVar11 != uVar14);
      if (uVar15 != 1) {
        uVar14 = (ulong)(uVar15 & 0x7fffffff) + 1;
        do {
          pdVar4 = *(double **)((long)pvVar6 + uVar14 * 8 + -0x18);
          pdVar5 = *(double **)((long)pvVar6 + uVar14 * 8 + -0x10);
          dVar1 = *pdVar5;
          if (*pdVar4 <= dVar1 && dVar1 != *pdVar4) {
            *(double **)((long)pvVar6 + uVar14 * 8 + -0x10) = pdVar4;
            *(double **)((long)pvVar6 + uVar14 * 8 + -0x18) = pdVar5;
          }
          uVar14 = uVar14 - 1;
        } while (2 < uVar14);
      }
      if (0 < (int)uVar15) {
        uVar14 = 0;
        do {
          uVar11 = 0;
          do {
            if (uVar11 != uVar14) {
              lVar9 = *(long *)((long)pvVar6 + uVar11 * 8);
              dVar1 = *(double *)(lVar9 + uVar14 * 8);
              lVar13 = *(long *)((long)pvVar6 + uVar14 * 8);
              dVar2 = *(double *)(lVar13 + uVar14 * 8);
              uVar12 = 0;
              do {
                *(double *)(lVar9 + uVar12 * 8) =
                     *(double *)(lVar9 + uVar12 * 8) -
                     *(double *)(lVar13 + uVar12 * 8) * (dVar1 / dVar2);
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != (uVar15 & 0x7fffffff));
          uVar14 = uVar14 + 1;
        } while (uVar14 != (uVar15 & 0x7fffffff));
        if (0 < (int)uVar15) {
          uVar14 = 0;
          do {
            lVar9 = *(long *)((long)pvVar6 + uVar14 * 8);
            dVar1 = *(double *)(lVar9 + uVar14 * 8);
            if (uVar10 == 0) {
              lVar13 = 0;
              do {
                *(double *)(lVar9 + lVar13 * 8) = *(double *)(lVar9 + lVar13 * 8) / dVar1;
                lVar13 = lVar13 + 1;
              } while (lVar13 != 0);
            }
            else {
              uVar11 = 0;
              do {
                auVar16._8_8_ = dVar1;
                auVar16._0_8_ = dVar1;
                auVar16 = divpd(*(undefined1 (*) [16])(lVar9 + uVar11 * 8),auVar16);
                *(undefined1 (*) [16])(lVar9 + uVar11 * 8) = auVar16;
                uVar11 = uVar11 + 2;
              } while (uVar10 != uVar11);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 != (uVar15 & 0x7fffffff));
          if (0 < (int)uVar15) {
            uVar10 = (ulong)(uVar15 & 0x7fffffff);
            uVar14 = 0;
            do {
              lVar9 = *(long *)((long)pvVar6 + uVar14 * 8);
              uVar11 = 0;
              do {
                peVar8[uVar11] = *(element_t *)(lVar9 + uVar10 * 8 + uVar11 * 8);
                uVar11 = uVar11 + 1;
              } while (uVar10 != uVar11);
              uVar14 = uVar14 + 1;
              peVar8 = peVar8 + uVar3;
            } while (uVar14 != uVar10);
          }
        }
      }
    }
    operator_delete__(pvVar6);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Inverse operation not possible, the elementsPointer need be square and the order grater than one"
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

size_t rows() const { return rows__; }